

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

decNumber *
uprv_decNumberCompareTotalMag_63(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set)

{
  decNumber *buffer;
  decNumber *buffer_00;
  uint32_t status_00;
  uint uVar1;
  long lVar2;
  decNumber *dest;
  decNumber *dest_00;
  uint32_t status;
  decNumber bufb [4];
  decNumber bufa [4];
  uint32_t local_a4;
  decContext *local_a0;
  decNumber local_98 [4];
  decNumber local_68 [4];
  
  local_a4 = 0;
  if ((char)lhs->bits < '\0') {
    uVar1 = lhs->digits;
    lVar2 = (long)(int)uVar1;
    if (lVar2 < 0x32) {
      if (lVar2 - 0x26U < 0xc) {
        uVar1 = (uint)""[lVar2];
        goto LAB_0024653c;
      }
      dest = local_68;
      buffer = (decNumber *)0x0;
    }
    else {
LAB_0024653c:
      buffer = (decNumber *)uprv_malloc_63((ulong)(uVar1 + 0xb));
      dest = buffer;
      if (buffer == (decNumber *)0x0) {
        status_00 = 0x10;
        goto LAB_0024662f;
      }
    }
    uprv_decNumberCopy_63(dest,lhs);
    dest->bits = dest->bits & 0x7f;
  }
  else {
    buffer = (decNumber *)0x0;
    dest = lhs;
  }
  if ((char)rhs->bits < '\0') {
    uVar1 = rhs->digits;
    lVar2 = (long)(int)uVar1;
    local_a0 = set;
    if (lVar2 < 0x32) {
      if (lVar2 - 0x26U < 0xc) {
        uVar1 = (uint)""[lVar2];
        goto LAB_002465ae;
      }
      dest_00 = local_98;
      buffer_00 = (decNumber *)0x0;
LAB_002465d9:
      uprv_decNumberCopy_63(dest_00,rhs);
      dest_00->bits = dest_00->bits & 0x7f;
      set = local_a0;
      goto LAB_002465f1;
    }
LAB_002465ae:
    buffer_00 = (decNumber *)uprv_malloc_63((ulong)(uVar1 + 0xb));
    dest_00 = buffer_00;
    if (buffer_00 != (decNumber *)0x0) goto LAB_002465d9;
    local_a4 = 0x10;
    buffer_00 = (decNumber *)0x0;
    set = local_a0;
  }
  else {
    buffer_00 = (decNumber *)0x0;
    dest_00 = rhs;
LAB_002465f1:
    decCompareOp(res,dest,dest_00,set,'\x04',&local_a4);
  }
  if (buffer != (decNumber *)0x0) {
    uprv_free_63(buffer);
  }
  if (buffer_00 != (decNumber *)0x0) {
    uprv_free_63(buffer_00);
  }
  status_00 = local_a4;
  if (local_a4 == 0) {
    return res;
  }
LAB_0024662f:
  decStatus(res,status_00,set);
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberCompareTotalMag(decNumber *res, const decNumber *lhs,
                                     const decNumber *rhs, decContext *set) {
  uInt status=0;                   /* accumulator  */
  uInt needbytes;                  /* for space calculations  */
  decNumber bufa[D2N(DECBUFFER+1)];/* +1 in case DECBUFFER=0  */
  decNumber *allocbufa=NULL;       /* -> allocated bufa, iff allocated  */
  decNumber bufb[D2N(DECBUFFER+1)];
  decNumber *allocbufb=NULL;       /* -> allocated bufb, iff allocated  */
  decNumber *a, *b;                /* temporary pointers  */

  #if DECCHECK
  if (decCheckOperands(res, lhs, rhs, set)) return res;
  #endif

  do {                                  /* protect allocated storage  */
    /* if either is negative, take a copy and absolute  */
    if (decNumberIsNegative(lhs)) {     /* lhs<0  */
      a=bufa;
      needbytes=sizeof(decNumber)+(D2U(lhs->digits)-1)*sizeof(Unit);
      if (needbytes>sizeof(bufa)) {     /* need malloc space  */
        allocbufa=(decNumber *)malloc(needbytes);
        if (allocbufa==NULL) {          /* hopeless -- abandon  */
          status|=DEC_Insufficient_storage;
          break;}
        a=allocbufa;                    /* use the allocated space  */
        }
      uprv_decNumberCopy(a, lhs);            /* copy content  */
      a->bits&=~DECNEG;                 /* .. and clear the sign  */
      lhs=a;                            /* use copy from here on  */
      }
    if (decNumberIsNegative(rhs)) {     /* rhs<0  */
      b=bufb;
      needbytes=sizeof(decNumber)+(D2U(rhs->digits)-1)*sizeof(Unit);
      if (needbytes>sizeof(bufb)) {     /* need malloc space  */
        allocbufb=(decNumber *)malloc(needbytes);
        if (allocbufb==NULL) {          /* hopeless -- abandon  */
          status|=DEC_Insufficient_storage;
          break;}
        b=allocbufb;                    /* use the allocated space  */
        }
      uprv_decNumberCopy(b, rhs);            /* copy content  */
      b->bits&=~DECNEG;                 /* .. and clear the sign  */
      rhs=b;                            /* use copy from here on  */
      }
    decCompareOp(res, lhs, rhs, set, COMPTOTAL, &status);
    } while(0);                         /* end protected  */

  if (allocbufa!=NULL) free(allocbufa); /* drop any storage used  */
  if (allocbufb!=NULL) free(allocbufb); /* ..  */
  if (status!=0) decStatus(res, status, set);
  return res;
  }